

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::UnpackUnorm4x8CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackUnorm4x8CaseInstance *this)

{
  undefined8 uVar1;
  ShaderExecutor *pSVar2;
  uint uVar3;
  uint uVar4;
  uint6 uVar5;
  deUint32 dVar6;
  pointer puVar7;
  pointer puVar8;
  ulong uVar9;
  TestStatus *pTVar10;
  int iVar11;
  Hex<8UL> hex;
  long lVar12;
  long lVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  uint uVar24;
  int iVar25;
  float fVar26;
  uint uVar27;
  int iVar28;
  undefined1 auVar29 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  void *out;
  deUint32 u32_1;
  deUint32 u32_3;
  deUint32 u32;
  HexFloat local_25c;
  HexFloat local_258;
  HexFloat local_254;
  HexFloat local_250;
  HexFloat local_24c;
  HexFloat local_248;
  HexFloat local_244;
  TestStatus *local_240;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> outputs;
  deUint32 u32_2;
  Random rnd;
  void *in;
  ostringstream local_1a8 [376];
  
  dVar6 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&rnd.m_rnd,dVar6 ^ 0x776002);
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in = (void *)((ulong)in._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x7fff8000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x80007fff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0xffffffff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x1fffe);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  iVar11 = 0x5f;
  while (bVar14 = iVar11 != 0, iVar11 = iVar11 + -1, bVar14) {
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    in = (void *)CONCAT44(in._4_4_,dVar6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&inputs,(uint *)&in);
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&outputs,(long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2);
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_240 = __return_storage_ptr__;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  in = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  iVar11 = 0;
  (*pSVar2->_vptr_ShaderExecutor[2])
            (pSVar2,(ulong)((long)inputs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,&in,&out,0);
  uVar9 = (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar13 = 0xc;
  puVar7 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  auVar20 = _DAT_00963870;
  auVar21 = _DAT_00974030;
  for (lVar12 = 0; lVar12 < (int)((ulong)((long)puVar8 - (long)puVar7) >> 2); lVar12 = lVar12 + 1) {
    uVar24 = puVar7[lVar12];
    uVar5 = CONCAT24((short)(uVar24 >> 0x10),uVar24 >> 0x18) & 0xffffffffff;
    auVar15._0_4_ = (float)(int)uVar5;
    auVar15._4_4_ = (float)(ushort)(uVar5 >> 0x20);
    auVar15._8_4_ = (float)((ushort)(uVar24 >> 8) & 0xff);
    auVar15._12_4_ = (float)((ushort)uVar24 & 0xff);
    auVar16._8_4_ = 0x437f0000;
    auVar16._0_8_ = 0x437f0000437f0000;
    auVar16._12_4_ = 0x437f0000;
    auVar16 = divps(auVar15,auVar16);
    uVar24 = (uint)(1.0 < auVar16._8_4_);
    uVar27 = (uint)(1.0 < auVar16._12_4_);
    u32 = (deUint32)1.0;
    if (auVar16._0_4_ <= 1.0) {
      u32 = (deUint32)auVar16._0_4_;
    }
    u32_1 = *(deUint32 *)
             ((long)(outputs.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13);
    uVar3 = u32_1 - u32;
    if (u32_1 < u32) {
      uVar3 = -(u32_1 - u32);
    }
    fVar22 = 1.0;
    if (auVar16._4_4_ <= 1.0) {
      fVar22 = auVar16._4_4_;
    }
    u32_3 = *(deUint32 *)
             ((long)(outputs.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -4);
    uVar4 = u32_3 - (int)fVar22;
    if (u32_3 < (uint)fVar22) {
      uVar4 = -(u32_3 - (int)fVar22);
    }
    auVar29._0_4_ = (int)(uVar24 * -0x80000000) >> 0x1f;
    auVar29._4_4_ = (int)(uVar27 * -0x80000000) >> 0x1f;
    auVar29._8_4_ = (int)(uVar24 * -0x80000000) >> 0x1f;
    auVar29._12_4_ = (int)(uVar27 * -0x80000000) >> 0x1f;
    auVar17._8_8_ = auVar16._8_8_;
    auVar17._0_8_ = auVar17._8_8_;
    auVar16 = auVar29 & auVar20 | ~auVar29 & auVar17;
    uVar1 = *(undefined8 *)
             ((long)(outputs.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13 + -0xc);
    fVar23 = (float)uVar1;
    fVar26 = (float)((ulong)uVar1 >> 0x20);
    uVar24 = -(uint)(SUB164(auVar16 ^ auVar21,0) < (int)((uint)fVar26 ^ auVar21._0_4_));
    uVar27 = -(uint)(SUB164(auVar16 ^ auVar21,4) < (int)((uint)fVar23 ^ auVar21._4_4_));
    iVar25 = uVar24 - ((int)fVar26 - (int)auVar16._0_4_ ^ uVar24);
    iVar28 = uVar27 - ((int)fVar23 - auVar16._4_4_ ^ uVar27);
    auVar18._4_4_ = iVar25;
    auVar18._0_4_ = iVar25;
    auVar18._8_4_ = iVar28;
    auVar18._12_4_ = iVar28;
    auVar18 = auVar18 ^ auVar21;
    auVar19._0_4_ = -(uint)(-0x7fffffff < auVar18._0_4_);
    auVar19._4_4_ = -(uint)(-0x7fffffff < auVar18._4_4_);
    auVar19._8_4_ = -(uint)(-0x7fffffff < auVar18._8_4_);
    auVar19._12_4_ = -(uint)(-0x7fffffff < auVar18._12_4_);
    uVar24 = movmskpd((int)outputs.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,auVar19);
    if ((((uVar24 & 2) != 0) || ((uVar24 & 1) != 0)) || (1 < (uVar4 | uVar3))) {
      if (iVar11 < 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"ERROR: Mismatch in value ");
        std::ostream::operator<<(local_1a8,(int)lVar12);
        std::operator<<((ostream *)local_1a8,",\n");
        std::operator<<((ostream *)local_1a8,"  expected unpackUnorm4x8(");
        hex.value._4_4_ = 0;
        hex.value._0_4_ =
             inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12];
        tcu::Format::operator<<((ostream *)local_1a8,hex);
        std::operator<<((ostream *)local_1a8,") = ");
        std::operator<<((ostream *)local_1a8,"vec4(");
        out = (void *)CONCAT44(out._4_4_,auVar16._4_4_);
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,(HexFloat *)&out);
        std::operator<<((ostream *)local_1a8,", ");
        local_244.value = auVar16._0_4_;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_244);
        std::operator<<((ostream *)local_1a8,", ");
        local_248.value = fVar22;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_248);
        std::operator<<((ostream *)local_1a8,", ");
        local_24c.value = (float)u32;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_24c);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,", got vec4(");
        local_250.value = fVar23;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_250);
        std::operator<<((ostream *)local_1a8,", ");
        local_254.value = fVar26;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_254);
        std::operator<<((ostream *)local_1a8,", ");
        local_258.value = (float)u32_3;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_258);
        std::operator<<((ostream *)local_1a8,", ");
        local_25c.value = (float)u32_1;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_25c);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,"\n  ULP diffs = (");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,"), max diff = ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        auVar20 = _DAT_00963870;
        auVar21 = _DAT_00974030;
      }
      else if (iVar11 == 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        auVar20 = _DAT_00963870;
        auVar21 = _DAT_00974030;
      }
      iVar11 = iVar11 + 1;
      puVar7 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    lVar13 = lVar13 + 0x10;
  }
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar25 = (int)(uVar9 >> 2);
  std::ostream::operator<<(local_1a8,iVar25 - iVar11);
  std::operator<<((ostream *)local_1a8," / ");
  std::ostream::operator<<(local_1a8,iVar25);
  std::operator<<((ostream *)local_1a8," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  if (iVar11 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&in,"Pass",(allocator<char> *)&out)
    ;
    pTVar10 = local_240;
    tcu::TestStatus::pass(local_240,(string *)&in);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&in,"Result comparison failed",(allocator<char> *)&out);
    pTVar10 = local_240;
    tcu::TestStatus::fail(local_240,(string *)&in);
  }
  std::__cxx11::string::~string((string *)&in);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&outputs.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return pTVar10;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec4>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint8	in0		= (deUint8)(inputs[valNdx] & 0xff);
				const deUint8	in1		= (deUint8)((inputs[valNdx] >> 8) & 0xff);
				const deUint8	in2		= (deUint8)((inputs[valNdx] >> 16) & 0xff);
				const deUint8	in3		= (deUint8)(inputs[valNdx] >> 24);
				const float		ref0	= de::clamp(float(in0) / 255.f, 0.0f, 1.0f);
				const float		ref1	= de::clamp(float(in1) / 255.f, 0.0f, 1.0f);
				const float		ref2	= de::clamp(float(in2) / 255.f, 0.0f, 1.0f);
				const float		ref3	= de::clamp(float(in3) / 255.f, 0.0f, 1.0f);
				const float		res0	= outputs[valNdx].x();
				const float		res1	= outputs[valNdx].y();
				const float		res2	= outputs[valNdx].z();
				const float		res3	= outputs[valNdx].w();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);
				const deUint32	diff2	= getUlpDiff(ref2, res2);
				const deUint32	diff3	= getUlpDiff(ref3, res3);

				if (diff0 > maxDiff || diff1 > maxDiff || diff2 > maxDiff || diff3 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackUnorm4x8(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec4(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ", " << HexFloat(ref2) << ", " << HexFloat(ref3) << ")"
															   << ", got vec4(" << HexFloat(res0) << ", " << HexFloat(res1) << ", " << HexFloat(res2) << ", " << HexFloat(res3) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << ", " << diff2 << ", " << diff3 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}